

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaB_rawget(lua_State *L)

{
  lua_State *in_RDI;
  int in_stack_0000000c;
  lua_State *in_stack_00000010;
  
  luaL_checktype(L,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  luaL_checkany(L,(int)((ulong)in_RDI >> 0x20));
  lua_settop(in_RDI,2);
  lua_rawget(in_stack_00000010,in_stack_0000000c);
  return 1;
}

Assistant:

static int luaB_rawget(lua_State*L){
luaL_checktype(L,1,5);
luaL_checkany(L,2);
lua_settop(L,2);
lua_rawget(L,1);
return 1;
}